

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

bool __thiscall
glslang::HlslParseContext::parseShaderStrings
          (HlslParseContext *this,TPpContext *ppContext,TInputScanner *input,bool versionWillBeError
          )

{
  int *piVar1;
  TInfoSink *this_00;
  uint uVar2;
  bool bVar3;
  TInfoSinkBase *pTVar4;
  uint uVar5;
  pointer s;
  TSourceLoc *pTVar6;
  HlslScanContext scanContext;
  HlslGrammar grammar;
  HlslScanContext local_1d0;
  HlslGrammar local_180;
  
  (this->super_TParseContextBase).super_TParseVersions.currentScanner = input;
  TPpContext::setInput(ppContext,input,versionWillBeError);
  local_1d0._vptr_HlslScanContext = (_func_int **)&PTR__HlslScanContext_0093c368;
  local_1d0.parseContext = &this->super_TParseContextBase;
  local_1d0.ppContext = ppContext;
  HlslTokenStream::HlslTokenStream(&local_180.super_HlslTokenStream,&local_1d0);
  local_180.super_HlslTokenStream._vptr_HlslTokenStream =
       (_func_int **)&PTR__HlslTokenStream_0093c388;
  local_180.intermediate = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  local_180.typeIdentifiers = false;
  local_180.unitNode = (TIntermNode *)0x0;
  local_180.parseContext = this;
  bVar3 = HlslGrammar::parse(&local_180);
  if (bVar3) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x50])(this);
    bVar3 = (this->super_TParseContextBase).super_TParseVersions.numErrors == 0;
  }
  else {
    if (input->singleLogical == true) {
      pTVar6 = &input->logicalSourceLoc;
    }
    else {
      uVar5 = ~input->finale + input->numSources;
      if (input->currentSource <= (int)uVar5) {
        uVar5 = input->currentSource;
      }
      uVar2 = 0;
      if (0 < (int)uVar5) {
        uVar2 = uVar5;
      }
      pTVar6 = input->loc + uVar2;
    }
    this_00 = (this->super_TParseContextBase).super_TParseVersions.infoSink;
    if (pTVar6->name == (TString *)0x0) {
      s = "";
    }
    else {
      s = (pTVar6->name->_M_dataplus)._M_p;
    }
    TInfoSinkBase::append(&this_00->info,s);
    TInfoSinkBase::append(&this_00->info,"(");
    pTVar4 = TInfoSinkBase::operator<<(&this_00->info,pTVar6->line);
    TInfoSinkBase::append(pTVar4,"): error at column ");
    pTVar4 = TInfoSinkBase::operator<<(pTVar4,pTVar6->column);
    TInfoSinkBase::append(pTVar4,", HLSL parsing failed.\n");
    piVar1 = &(this->super_TParseContextBase).super_TParseVersions.numErrors;
    *piVar1 = *piVar1 + 1;
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool HlslParseContext::parseShaderStrings(TPpContext& ppContext, TInputScanner& input, bool versionWillBeError)
{
    currentScanner = &input;
    ppContext.setInput(input, versionWillBeError);

    HlslScanContext scanContext(*this, ppContext);
    HlslGrammar grammar(scanContext, *this);
    if (!grammar.parse()) {
        // Print a message formated such that if you click on the message it will take you right to
        // the line through most UIs.
        const glslang::TSourceLoc& sourceLoc = input.getSourceLoc();
        infoSink.info << sourceLoc.getFilenameStr() << "(" << sourceLoc.line << "): error at column " << sourceLoc.column
                      << ", HLSL parsing failed.\n";
        ++numErrors;
        return false;
    }

    finish();

    return numErrors == 0;
}